

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O2

bool __thiscall spv::Builder::isGlobalVariable(Builder *this,Id resultId)

{
  StorageClass SVar1;
  
  if ((this->module).idToInstruction.
      super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
      super__Vector_impl_data._M_start[resultId]->opCode != OpVariable) {
    return false;
  }
  SVar1 = getStorageClass(this,resultId);
  return SVar1 != Function;
}

Assistant:

Instruction* getInstruction(Id id) const { return idToInstruction[id]; }